

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

uint16_t icu_63::writeFactorSuffix
                   (uint16_t *factors,uint16_t count,char *s,uint32_t code,uint16_t *indexes,
                   char **elementBases,char **elements,char *buffer,uint16_t bufferLength)

{
  char cVar1;
  ushort uVar2;
  char *pcVar3;
  uint16_t local_3e;
  uint16_t local_3c;
  ushort local_3a;
  char c;
  uint16_t bufferPos;
  uint16_t factor;
  char **ppcStack_38;
  uint16_t i;
  char **elementBases_local;
  uint16_t *indexes_local;
  char *pcStack_20;
  uint32_t code_local;
  char *s_local;
  uint16_t count_local;
  uint16_t *factors_local;
  
  local_3e = 0;
  indexes_local._4_4_ = code;
  for (local_3a = count - 1; local_3a != 0; local_3a = local_3a - 1) {
    uVar2 = factors[local_3a];
    indexes[local_3a] = (uint16_t)(indexes_local._4_4_ % (uint)uVar2);
    indexes_local._4_4_ = indexes_local._4_4_ / uVar2;
  }
  *indexes = (uint16_t)indexes_local._4_4_;
  ppcStack_38 = elementBases;
  pcStack_20 = s;
  while( true ) {
    if (ppcStack_38 != (char **)0x0) {
      *ppcStack_38 = pcStack_20;
      ppcStack_38 = ppcStack_38 + 1;
    }
    for (local_3c = indexes[local_3a]; local_3c != 0; local_3c = local_3c - 1) {
      do {
        pcVar3 = pcStack_20 + 1;
        cVar1 = *pcStack_20;
        pcStack_20 = pcVar3;
      } while (cVar1 != '\0');
    }
    if (elements != (char **)0x0) {
      *elements = pcStack_20;
      elements = elements + 1;
    }
    while( true ) {
      if (*pcStack_20 == '\0') break;
      if (bufferLength != 0) {
        *buffer = *pcStack_20;
        bufferLength = bufferLength - 1;
        buffer = buffer + 1;
      }
      local_3e = local_3e + 1;
      pcStack_20 = pcStack_20 + 1;
    }
    if ((ushort)(count - 1) <= local_3a) break;
    local_3c = factors[local_3a] - indexes[local_3a];
    pcStack_20 = pcStack_20 + 1;
    while (local_3c = local_3c + -1, local_3c != 0) {
      do {
        pcVar3 = pcStack_20 + 1;
        cVar1 = *pcStack_20;
        pcStack_20 = pcVar3;
      } while (cVar1 != '\0');
    }
    local_3a = local_3a + 1;
  }
  if (bufferLength != 0) {
    *buffer = '\0';
  }
  return local_3e;
}

Assistant:

static uint16_t
writeFactorSuffix(const uint16_t *factors, uint16_t count,
                  const char *s, /* suffix elements */
                  uint32_t code,
                  uint16_t indexes[8], /* output fields from here */
                  const char *elementBases[8], const char *elements[8],
                  char *buffer, uint16_t bufferLength) {
    uint16_t i, factor, bufferPos=0;
    char c;

    /* write elements according to the factors */

    /*
     * the factorized elements are determined by modulo arithmetic
     * with the factors of this algorithm
     *
     * note that for fewer operations, count is decremented here
     */
    --count;
    for(i=count; i>0; --i) {
        factor=factors[i];
        indexes[i]=(uint16_t)(code%factor);
        code/=factor;
    }
    /*
     * we don't need to calculate the last modulus because start<=code<=end
     * guarantees here that code<=factors[0]
     */
    indexes[0]=(uint16_t)code;

    /* write each element */
    for(;;) {
        if(elementBases!=NULL) {
            *elementBases++=s;
        }

        /* skip indexes[i] strings */
        factor=indexes[i];
        while(factor>0) {
            while(*s++!=0) {}
            --factor;
        }
        if(elements!=NULL) {
            *elements++=s;
        }

        /* write element */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        /* we do not need to perform the rest of this loop for i==count - break here */
        if(i>=count) {
            break;
        }

        /* skip the rest of the strings for this factors[i] */
        factor=(uint16_t)(factors[i]-indexes[i]-1);
        while(factor>0) {
            while(*s++!=0) {}
            --factor;
        }

        ++i;
    }

    /* zero-terminate */
    if(bufferLength>0) {
        *buffer=0;
    }

    return bufferPos;
}